

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_shared_code_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::SharedCodeGenerator::Generate
          (SharedCodeGenerator *this,GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *annotation_file_list)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  long *plVar3;
  undefined4 extraout_var;
  Printer *this_00;
  ZeroCopyOutputStream *output_00;
  size_type *psVar4;
  AnnotationCollector *annotation_collector_00;
  pointer __old_p;
  pointer *__ptr;
  unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
  printer;
  string filename;
  string info_full_path;
  string info_relative_path;
  string classname;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  GeneratedCodeInfo annotations;
  string java_package;
  string package_dir;
  value_type local_170;
  value_type local_150;
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [16];
  string local_110;
  string local_f0;
  AnnotationCollector local_d0;
  GeneratedCodeInfo *local_c8;
  GeneratedCodeInfo local_c0;
  string local_90;
  string local_70;
  string local_50;
  ZeroCopyOutputStream *output;
  undefined4 extraout_var_00;
  
  FileJavaPackage_abi_cxx11_(&local_70,(java *)this->file_,(FileDescriptor *)file_list);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  JavaPackageToDir(&local_50,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((this->options_).enforce_lite == false) {
    ClassNameResolver::GetDescriptorClassName_abi_cxx11_
              (&local_110,
               (this->name_resolver_)._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::java::ClassNameResolver,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
               .super__Head_base<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_false>.
               _M_head_impl,this->file_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                   &local_50,&local_110);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_c0);
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_170.field_2._M_allocated_capacity = *psVar4;
      local_170.field_2._8_8_ = plVar3[3];
    }
    else {
      local_170.field_2._M_allocated_capacity = *psVar4;
      local_170._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_170._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *)
        local_c0.super_Message.super_MessageLite._vptr_MessageLite != &local_c0.annotation_) {
      operator_delete(local_c0.super_Message.super_MessageLite._vptr_MessageLite);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(file_list,&local_170);
    iVar2 = (*context->_vptr_GeneratorContext[2])(context);
    output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2);
    GeneratedCodeInfo::GeneratedCodeInfo(&local_c0,(Arena *)0x0,false);
    local_d0._vptr_AnnotationCollector = (_func_int **)&PTR_AddAnnotation_004dc430;
    local_c8 = &local_c0;
    this_00 = (Printer *)operator_new(0xa0);
    annotation_collector_00 = &local_d0;
    if ((this->options_).annotate_code == false) {
      annotation_collector_00 = (AnnotationCollector *)0x0;
    }
    io::Printer::Printer(this_00,output,'$',annotation_collector_00);
    local_130 = local_120;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,local_110._M_dataplus._M_p,
               local_110._M_dataplus._M_p + local_110._M_string_length);
    std::__cxx11::string::append((char *)&local_130);
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,local_170._M_dataplus._M_p,
               local_170._M_dataplus._M_p + local_170._M_string_length);
    std::__cxx11::string::append((char *)&local_150);
    io::Printer::Print<char[9],std::__cxx11::string>
              (this_00,
               "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
               ,(char (*) [9])"filename",
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this->file_);
    if (local_70._M_string_length != 0) {
      io::Printer::Print<char[8],std::__cxx11::string>
                (this_00,"package $package$;\n\n",(char (*) [8])0x442ebe,&local_70);
    }
    paVar1 = &local_f0.field_2;
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    if ((this->options_).annotate_code == true) {
      std::__cxx11::string::_M_construct<char*>((string *)&local_f0,local_130,local_130 + local_128)
      ;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
    }
    PrintGeneratedAnnotation(this_00,'$',&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    io::Printer::Print<char[10],std::__cxx11::string>
              (this_00,
               "public final class $classname$ {\n  public static com.google.protobuf.Descriptors.FileDescriptor\n      descriptor;\n  static {\n"
               ,(char (*) [10])0x3f42d2,&local_110);
    io::Printer::Annotate(this_00,"classname","classname",*(string **)this->file_);
    io::Printer::Indent(this_00);
    io::Printer::Indent(this_00);
    GenerateDescriptors(this,this_00);
    io::Printer::Outdent(this_00);
    io::Printer::Outdent(this_00);
    io::Printer::Print<>(this_00,"  }\n}\n");
    if ((this->options_).annotate_code == true) {
      iVar2 = (*context->_vptr_GeneratorContext[2])(context,&local_150);
      output_00 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar2);
      MessageLite::SerializeToZeroCopyStream((MessageLite *)&local_c0,output_00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(annotation_file_list,&local_150);
      if (output_00 != (ZeroCopyOutputStream *)0x0) {
        (*output_00->_vptr_ZeroCopyOutputStream[1])(output_00);
      }
    }
    if (this_00 != (Printer *)0x0) {
      io::Printer::~Printer(this_00);
      operator_delete(this_00);
    }
    if (output != (ZeroCopyOutputStream *)0x0) {
      (*output->_vptr_ZeroCopyOutputStream[1])(output);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if (local_130 != local_120) {
      operator_delete(local_130);
    }
    GeneratedCodeInfo::~GeneratedCodeInfo(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SharedCodeGenerator::Generate(
    GeneratorContext* context, std::vector<std::string>* file_list,
    std::vector<std::string>* annotation_file_list) {
  std::string java_package = FileJavaPackage(file_);
  std::string package_dir = JavaPackageToDir(java_package);

  if (HasDescriptorMethods(file_, options_.enforce_lite)) {
    // Generate descriptors.
    std::string classname = name_resolver_->GetDescriptorClassName(file_);
    std::string filename = package_dir + classname + ".java";
    file_list->push_back(filename);
    std::unique_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    std::unique_ptr<io::Printer> printer(
        new io::Printer(output.get(), '$',
                        options_.annotate_code ? &annotation_collector : NULL));
    std::string info_relative_path = classname + ".java.pb.meta";
    std::string info_full_path = filename + ".pb.meta";
    printer->Print(
        "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
        "// source: $filename$\n"
        "\n",
        "filename", file_->name());
    if (!java_package.empty()) {
      printer->Print(
          "package $package$;\n"
          "\n",
          "package", java_package);
    }
    PrintGeneratedAnnotation(printer.get(), '$',
                             options_.annotate_code ? info_relative_path : "");
    printer->Print(
        "public final class $classname$ {\n"
        "  public static com.google.protobuf.Descriptors.FileDescriptor\n"
        "      descriptor;\n"
        "  static {\n",
        "classname", classname);
    printer->Annotate("classname", file_->name());
    printer->Indent();
    printer->Indent();
    GenerateDescriptors(printer.get());
    printer->Outdent();
    printer->Outdent();
    printer->Print(
        "  }\n"
        "}\n");

    if (options_.annotate_code) {
      std::unique_ptr<io::ZeroCopyOutputStream> info_output(
          context->Open(info_full_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
      annotation_file_list->push_back(info_full_path);
    }

    printer.reset();
    output.reset();
  }
}